

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

void cg_generate_static_block(dill_stream s,cod_code descr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long in_RSI;
  long *in_RDI;
  dill_reg ret;
  dill_reg ec;
  dill_reg cod_ctx;
  
  if (*(int *)(in_RSI + 8) == 0) {
    (**(code **)(*in_RDI + 0x110))
              (in_RDI,8,0,*(undefined4 *)(in_RSI + 0x24),*(undefined8 *)(in_RSI + 0x18));
  }
  else {
    uVar1 = dill_param_reg(in_RDI,0);
    uVar2 = dill_getreg(in_RDI,8);
    (**(code **)(*in_RDI + 0xc0))(in_RDI,8,0,uVar2,uVar1,0);
    uVar1 = dill_scallp(in_RDI,dill_get_client_data,"dill_get_client_data","%p%I",uVar2,0x23234);
    (**(code **)(*in_RDI + 0xf8))(in_RDI,8,0,*(undefined4 *)(in_RSI + 0x24),uVar1);
  }
  return;
}

Assistant:

static void
cg_generate_static_block(dill_stream s, cod_code descr)
{
    if (descr->has_exec_ctx) {
	dill_reg cod_ctx = dill_param_reg(s, 0);
	dill_reg ec = dill_getreg(s, DILL_P);
	dill_reg ret;
	dill_ldpi(s, ec, cod_ctx, FMOffset(struct cod_exec_struct *, ec));
	ret = dill_scallp(s, (void*)&dill_get_client_data, "dill_get_client_data", "%p%I", ec, 0x23234);
	dill_movp(s, descr->static_block_address_register, ret);
    } else {
	dill_setp(s, descr->static_block_address_register, descr->data);
    }
}